

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O2

MemberIterator __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
DoFindMember<rapidjson::CrtAllocator>
          (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           *this,GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *name)

{
  bool bVar1;
  Number in_RAX;
  GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *in_RDX;
  undefined8 local_28;
  
  local_28 = in_RAX;
  MemberBegin(this);
  while( true ) {
    MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&stack0xffffffffffffffd8);
    if (*(I *)&(this->data_).n == (I)local_28) {
      return (MemberIterator)(Pointer)this;
    }
    bVar1 = GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
            StringEqual<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      (in_RDX,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               *)*(I *)&(this->data_).n);
    if (bVar1) break;
    (this->data_).n = (Number)((this->data_).n.i64 + 0x20);
  }
  return (MemberIterator)(Pointer)this;
}

Assistant:

MemberIterator DoFindMember(const GenericValue<Encoding, SourceAllocator>& name) {
        MemberIterator member = MemberBegin();
        for ( ; member != MemberEnd(); ++member)
            if (name.StringEqual(member->name))
                break;
        return member;
    }